

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollisionObject.cpp
# Opt level: O1

aphy_matrix3x3 * __thiscall
APhyBullet::BulletCollisionObject::getMatrix(BulletCollisionObject *this)

{
  btTransform *pbVar1;
  btCollisionObject *pbVar2;
  aphy_vector3 aVar3;
  aphy_vector3 aVar4;
  aphy_vector3 aVar5;
  btMatrix3x3 *pbVar6;
  aphy_matrix3x3 *in_RDI;
  
  pbVar2 = this->handle;
  pbVar1 = &pbVar2->m_worldTransform;
  aVar3.pad = 0.0;
  aVar3.x = (pbVar1->m_basis).m_el[0].m_floats[0];
  aVar3.y = (pbVar1->m_basis).m_el[0].m_floats[1];
  aVar3.z = (pbVar1->m_basis).m_el[0].m_floats[2];
  in_RDI->firstRow = aVar3;
  pbVar6 = &(pbVar2->m_worldTransform).m_basis;
  aVar4.pad = 0.0;
  aVar4.x = pbVar6->m_el[1].m_floats[0];
  aVar4.y = pbVar6->m_el[1].m_floats[1];
  aVar4.z = pbVar6->m_el[1].m_floats[2];
  in_RDI->secondRow = aVar4;
  pbVar6 = &(pbVar2->m_worldTransform).m_basis;
  aVar5.pad = 0.0;
  aVar5.x = pbVar6->m_el[2].m_floats[0];
  aVar5.y = pbVar6->m_el[2].m_floats[1];
  aVar5.z = pbVar6->m_el[2].m_floats[2];
  in_RDI->thirdRow = aVar5;
  return in_RDI;
}

Assistant:

aphy_matrix3x3 BulletCollisionObject::getMatrix()
{
    return convertMatrix(handle->getWorldTransform().getBasis());
}